

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O3

bool __thiscall cmdline::parser::parse(parser *this,int argc,char **argv)

{
  string *psVar1;
  undefined1 uVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  long *plVar8;
  _Base_ptr p_Var9;
  char *pcVar10;
  size_t sVar11;
  size_type sVar12;
  const_iterator cVar13;
  mapped_type *ppoVar14;
  size_type *psVar15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  int iVar18;
  _Base_ptr p_Var19;
  _Base_ptr p_Var20;
  _Self __tmp;
  long lVar21;
  parser *this_00;
  char *pcVar22;
  _Self __tmp_1;
  bool bVar23;
  char initial;
  string name;
  string val;
  char last;
  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  lookup;
  char local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  parser *local_a8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_a0;
  int local_94;
  _Base_ptr local_90;
  long *local_88;
  ulong local_80;
  long local_78 [2];
  undefined1 local_68 [32];
  _Base_ptr local_48;
  size_t local_40;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_38;
  
  local_a0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a0,
                    (this->errors).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_38 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->others;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_38,
                    (this->others).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_94 = argc;
  if (argc < 1) {
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"argument number must be longer than 0","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_68);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
    }
    bVar23 = false;
  }
  else {
    psVar1 = &this->prog_name;
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    local_a8 = this;
    if (iVar4 == 0) {
      pcVar22 = *argv;
      pcVar10 = (char *)(this->prog_name)._M_string_length;
      strlen(pcVar22);
      this = local_a8;
      std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar10,(ulong)pcVar22);
    }
    local_68._24_8_ = local_68 + 8;
    local_68._8_4_ = _S_red;
    local_68._16_8_ = (_Base_ptr)0x0;
    local_40 = 0;
    p_Var7 = (this->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_90 = &(this->options)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_48 = (_Base_ptr)local_68._24_8_;
    if (p_Var7 != local_90) {
      do {
        if ((p_Var7[1]._M_parent != (_Base_ptr)0x0) &&
           (local_e9 = (**(code **)(**(long **)(p_Var7 + 2) + 0x48))(), local_e9 != '\0')) {
          if ((_Base_ptr)local_68._16_8_ != (_Base_ptr)0x0) {
            p_Var20 = (_Base_ptr)local_68._16_8_;
            p_Var17 = (_Base_ptr)(local_68 + 8);
            do {
              p_Var19 = p_Var17;
              p_Var16 = p_Var20;
              uVar2 = (undefined1)p_Var16[1]._M_color;
              p_Var17 = p_Var16;
              if ((char)uVar2 < local_e9) {
                p_Var17 = p_Var19;
              }
              p_Var20 = (&p_Var16->_M_left)[(char)uVar2 < local_e9];
            } while ((&p_Var16->_M_left)[(char)uVar2 < local_e9] != (_Base_ptr)0x0);
            if (p_Var17 != (_Base_ptr)(local_68 + 8)) {
              if ((char)uVar2 < local_e9) {
                p_Var16 = p_Var19;
              }
              if ((char)p_Var16[1]._M_color <= local_e9) {
                pmVar6 = std::
                         map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)local_68,&local_e9);
                std::__cxx11::string::_M_replace
                          ((ulong)pmVar6,0,(char *)pmVar6->_M_string_length,0x138538);
                local_88 = local_78;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_88,"short option \'","");
                plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                                           ((ulong)&local_88,local_80,0,'\x01');
                psVar15 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar15) {
                  local_c8.field_2._M_allocated_capacity = *psVar15;
                  local_c8.field_2._8_8_ = plVar8[3];
                  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                }
                else {
                  local_c8.field_2._M_allocated_capacity = *psVar15;
                  local_c8._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_c8._M_string_length = plVar8[1];
                *plVar8 = (long)psVar15;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                plVar8 = (long *)std::__cxx11::string::append((char *)&local_c8);
                psVar15 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar15) {
                  local_e8.field_2._M_allocated_capacity = *psVar15;
                  local_e8.field_2._8_8_ = plVar8[3];
                  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                }
                else {
                  local_e8.field_2._M_allocated_capacity = *psVar15;
                  local_e8._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_e8._M_string_length = plVar8[1];
                *plVar8 = (long)psVar15;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>(local_a0,&local_e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p,
                                  local_c8.field_2._M_allocated_capacity + 1);
                }
                if (local_88 != local_78) {
                  operator_delete(local_88,local_78[0] + 1);
                }
                bVar23 = false;
                goto LAB_00125399;
              }
            }
          }
          pmVar6 = std::
                   map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_68,&local_e9);
          std::__cxx11::string::_M_assign((string *)pmVar6);
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while (p_Var7 != local_90);
    }
    this_00 = local_a8;
    if (local_94 != 1) {
      iVar4 = 1;
      do {
        pcVar22 = argv[iVar4];
        iVar18 = iVar4;
        if (*pcVar22 != '-') {
          std::__cxx11::string::string((string *)&local_e8,pcVar22,(allocator *)&local_c8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_38,&local_e8);
          goto LAB_001254e9;
        }
        if (pcVar22[1] == '-') {
          pcVar22 = pcVar22 + 2;
          pcVar10 = strchr(pcVar22,0x3d);
          if (pcVar10 == (char *)0x0) {
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            sVar11 = strlen(pcVar22);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e8,pcVar22,pcVar22 + sVar11);
            cVar13 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                             *)this_00,&local_e8);
            if (cVar13._M_node == local_90) {
              std::operator+(&local_c8,"undefined option: --",&local_e8);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_a0,&local_c8);
              goto LAB_001254ab;
            }
            ppoVar14 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                       ::operator[](&this_00->options,&local_e8);
            iVar5 = (*(*ppoVar14)->_vptr_option_base[2])();
            if ((char)iVar5 == '\0') {
              set_option(this_00,&local_e8);
            }
            else {
              iVar18 = iVar4 + 1;
              if (local_94 <= iVar18) {
                std::operator+(&local_c8,"option needs value: --",&local_e8);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>(local_a0,&local_c8);
                goto LAB_001254ab;
              }
              std::__cxx11::string::string((string *)&local_c8,argv[iVar18],(allocator *)&local_88);
              set_option(this_00,&local_e8,&local_c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
          else {
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,pcVar22,pcVar10);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            sVar11 = strlen(pcVar10 + 1);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,pcVar10 + 1,pcVar10 + sVar11 + 1);
            set_option(this_00,&local_e8,&local_c8);
LAB_001254ab:
            iVar18 = iVar4;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
          }
LAB_001254e9:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
        }
        else if (pcVar22[1] != '\0') {
          local_88 = (long *)CONCAT71(local_88._1_7_,pcVar22[1]);
          cVar3 = pcVar22[2];
          if (cVar3 != '\0') {
            lVar21 = 1;
            do {
              local_88 = (long *)CONCAT71(local_88._1_7_,cVar3);
              sVar12 = std::
                       map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::count((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_68,pcVar22 + lVar21);
              if (sVar12 == 0) {
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_c8,"undefined short option: -","");
                plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                                           ((ulong)&local_c8,local_c8._M_string_length,0,'\x01');
                local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                psVar15 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar15) {
                  local_e8.field_2._M_allocated_capacity = *psVar15;
                  local_e8.field_2._8_8_ = plVar8[3];
                }
                else {
                  local_e8.field_2._M_allocated_capacity = *psVar15;
                  local_e8._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_e8._M_string_length = plVar8[1];
                *plVar8 = (long)psVar15;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>(local_a0,&local_e8);
LAB_001256cf:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p,
                                  local_c8.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                pmVar6 = std::
                         map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)local_68,argv[iVar4] + lVar21);
                iVar5 = std::__cxx11::string::compare((char *)pmVar6);
                if (iVar5 == 0) {
                  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_c8,"ambiguous short option: -","");
                  plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                                             ((ulong)&local_c8,local_c8._M_string_length,0,'\x01');
                  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                  psVar15 = (size_type *)(plVar8 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar8 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar15) {
                    local_e8.field_2._M_allocated_capacity = *psVar15;
                    local_e8.field_2._8_8_ = plVar8[3];
                  }
                  else {
                    local_e8.field_2._M_allocated_capacity = *psVar15;
                    local_e8._M_dataplus._M_p = (pointer)*plVar8;
                  }
                  local_e8._M_string_length = plVar8[1];
                  *plVar8 = (long)psVar15;
                  plVar8[1] = 0;
                  *(undefined1 *)(plVar8 + 2) = 0;
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>(local_a0,&local_e8);
                  goto LAB_001256cf;
                }
                pmVar6 = std::
                         map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)local_68,argv[iVar4] + lVar21);
                set_option(local_a8,pmVar6);
              }
              pcVar22 = argv[iVar4];
              cVar3 = pcVar22[lVar21 + 2];
              lVar21 = lVar21 + 1;
            } while (cVar3 != '\0');
          }
          if ((_Base_ptr)local_68._16_8_ == (_Base_ptr)0x0) {
LAB_0012577a:
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,"undefined short option: -","");
            plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                                       ((ulong)&local_c8,local_c8._M_string_length,0,'\x01');
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            psVar15 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_e8.field_2._M_allocated_capacity = *psVar15;
              local_e8.field_2._8_8_ = plVar8[3];
            }
            else {
              local_e8.field_2._M_allocated_capacity = *psVar15;
              local_e8._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_e8._M_string_length = plVar8[1];
            *plVar8 = (long)psVar15;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_a0,&local_e8);
          }
          else {
            p_Var7 = (_Base_ptr)local_68._16_8_;
            p_Var20 = (_Base_ptr)(local_68 + 8);
            do {
              p_Var16 = p_Var20;
              p_Var17 = p_Var7;
              uVar2 = (undefined1)p_Var17[1]._M_color;
              p_Var20 = p_Var17;
              if ((char)uVar2 < (char)local_88._0_1_) {
                p_Var20 = p_Var16;
              }
              p_Var7 = (&p_Var17->_M_left)[(char)uVar2 < (char)local_88._0_1_];
            } while ((&p_Var17->_M_left)[(char)uVar2 < (char)local_88._0_1_] != (_Base_ptr)0x0);
            if (p_Var20 == (_Base_ptr)(local_68 + 8)) goto LAB_0012577a;
            if ((char)uVar2 < (char)local_88._0_1_) {
              p_Var17 = p_Var16;
            }
            if ((char)local_88._0_1_ < (char)p_Var17[1]._M_color) goto LAB_0012577a;
            pmVar6 = std::
                     map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_68,(key_type *)&local_88);
            iVar5 = std::__cxx11::string::compare((char *)pmVar6);
            if (iVar5 != 0) {
              iVar18 = iVar4 + 1;
              if (iVar18 < local_94) {
                pmVar6 = std::
                         map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)local_68,(key_type *)&local_88);
                ppoVar14 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                           ::operator[](&local_a8->options,pmVar6);
                iVar5 = (*(*ppoVar14)->_vptr_option_base[2])();
                if ((char)iVar5 != '\0') {
                  pmVar6 = std::
                           map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)local_68,(key_type *)&local_88);
                  std::__cxx11::string::string
                            ((string *)&local_e8,argv[iVar18],(allocator *)&local_c8);
                  set_option(local_a8,pmVar6,&local_e8);
                  this_00 = local_a8;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p,
                                    local_e8.field_2._M_allocated_capacity + 1);
                    this_00 = local_a8;
                  }
                  goto LAB_001258f8;
                }
              }
              pmVar6 = std::
                       map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_68,(key_type *)&local_88);
              set_option(local_a8,pmVar6);
              this_00 = local_a8;
              iVar18 = iVar4;
              goto LAB_001258f8;
            }
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,"ambiguous short option: -","");
            plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                                       ((ulong)&local_c8,local_c8._M_string_length,0,'\x01');
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            psVar15 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_e8.field_2._M_allocated_capacity = *psVar15;
              local_e8.field_2._8_8_ = plVar8[3];
            }
            else {
              local_e8.field_2._M_allocated_capacity = *psVar15;
              local_e8._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_e8._M_string_length = plVar8[1];
            *plVar8 = (long)psVar15;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_a0,&local_e8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          this_00 = local_a8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            this_00 = local_a8;
          }
        }
LAB_001258f8:
        iVar4 = iVar18 + 1;
      } while (iVar4 < local_94);
    }
    p_Var9 = (this_00->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var9 != local_90) {
      do {
        cVar3 = (**(code **)(**(long **)(p_Var9 + 2) + 0x30))();
        if (cVar3 == '\0') {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,*(long *)(p_Var9 + 1),
                     (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
          plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x1386bb);
          psVar15 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_e8.field_2._M_allocated_capacity = *psVar15;
            local_e8.field_2._8_8_ = plVar8[3];
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar15;
            local_e8._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_e8._M_string_length = plVar8[1];
          *plVar8 = (long)psVar15;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_a0,&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while (p_Var9 != local_90);
    }
    bVar23 = (local_a8->errors).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish ==
             (local_a8->errors).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
LAB_00125399:
    std::
    _Rb_tree<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_68);
  }
  return bVar23;
}

Assistant:

bool parse(int argc, const char *const argv[])
		{
			errors.clear();
			others.clear();

			if(argc < 1)
			{
				errors.push_back("argument number must be longer than 0");
				return false;
			}

			if(prog_name == "")
				prog_name = argv[0];

			std::map<char, std::string> lookup;
			for(std::map<std::string, option_base *>::iterator p = options.begin(); p != options.end(); p++)
			{
				if(p->first.length() == 0)
					continue;

				char initial = p->second->short_name();
				if(initial)
				{
					if(lookup.count(initial) > 0)
					{
						lookup[initial] = "";
						errors.push_back(std::string("short option '") + initial + "' is ambiguous");
						return false;
					}
					else
						lookup[initial] = p->first;
				}
			}

			for(int i = 1; i < argc; i++)
			{
				if(strncmp(argv[i], "--", 2) == 0)
				{
					const char *p = strchr(argv[i] + 2, '=');
					if(p)
					{
						std::string name(argv[i] + 2, p);
						std::string val(p + 1);
						set_option(name, val);
					}
					else
					{
						std::string name(argv[i] + 2);
						if(options.count(name) == 0)
						{
							errors.push_back("undefined option: --" + name);
							continue;
						}
						if(options[name]->has_value())
						{
							if(i + 1 >= argc)
							{
								errors.push_back("option needs value: --" + name);
								continue;
							}
							else
							{
								i++;
								set_option(name, argv[i]);
							}
						}
						else
						{
							set_option(name);
						}
					}
				}
				else if(strncmp(argv[i], "-", 1) == 0)
				{
					if(!argv[i][1])
						continue;

					char last = argv[i][1];
					for(int j = 2; argv[i][j]; j++)
					{
						last = argv[i][j];
						if(lookup.count(argv[i][j - 1]) == 0)
						{
							errors.push_back(std::string("undefined short option: -") + argv[i][j - 1]);
							continue;
						}

						if(lookup[argv[i][j - 1]] == "")
						{
							errors.push_back(std::string("ambiguous short option: -") + argv[i][j - 1]);
							continue;
						}

						set_option(lookup[argv[i][j - 1]]);
					}

					if(lookup.count(last) == 0)
					{
						errors.push_back(std::string("undefined short option: -") + last);
						continue;
					}

					if(lookup[last] == "")
					{
						errors.push_back(std::string("ambiguous short option: -") + last);
						continue;
					}

					if(i + 1 < argc && options[lookup[last]]->has_value())
					{
						set_option(lookup[last], argv[i + 1]);
						i++;
					}
					else
					{
						set_option(lookup[last]);
					}
				}
				else
				{
					others.push_back(argv[i]);
				}
			}

			for(std::map<std::string, option_base *>::iterator p = options.begin(); p != options.end(); p++)
			{
				if(!p->second->valid())
				{
					errors.push_back("need option: --" + std::string(p->first));
				}
			}

			return errors.size() == 0;
		}